

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::removeRowSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int row;
  Result RVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  
  piVar2 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar2) {
    lVar4 = 0;
    do {
      row = piVar2[lVar4];
      if (((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[row] == '\0') &&
         ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row] < 2)) {
        RVar1 = rowPresolve(this,postsolve_stack,row);
        if (RVar1 != kOk) {
          return RVar1;
        }
        piVar2 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != (long)piVar3 - (long)piVar2 >> 2);
  }
  if (piVar3 != piVar2) {
    (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeRowSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonRows.size(); ++i) {
    HighsInt row = singletonRows[i];
    if (rowDeleted[row] || rowsize[row] > 1) continue;
    // row presolve will delegate to rowSingleton() if the row size is 1
    // if the singleton row has become empty it will also remove the row
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
  }

  singletonRows.clear();

  return Result::kOk;
}